

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Player::action(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int choice)

{
  vector<int,_std::allocator<int>_> local_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(choice) {
  case 0:
    move(&local_28,this,1,0);
    break;
  case 1:
    move(&local_28,this,-1,0);
    break;
  case 2:
    move(&local_28,this,0,1);
    break;
  case 3:
    move(&local_28,this,0,-1);
    break;
  default:
    move(&local_28,this,0,0);
  }
  std::vector<int,_std::allocator<int>_>::_M_move_assign(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::action(int choice)
{
    std::vector<int> vec1;
    if (choice == 0)
    {
        vec1 = this->move(1, 0);
    }
    else if (choice == 1)
    {
        vec1 = this->move(-1, 0);
    }
    else if (choice == 2)
    {
        vec1 = this->move(0, 1);
    }
    else if (choice == 3)
    {
        vec1 = this->move(0, -1);
    }
    else
    {
        vec1 = this->move(0, 0);
    }
    /**
    else if (choice == 4)
    {
        vec1 = this->move(0, 0, 1);
    }
    else if (choice == 5)
    {
        vec1 = this->move(0, 0, -1); //Looks good
     }
     **/
    return vec1;
}